

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * tinyformat::format<short>(string *__return_storage_ptr__,char *fmt,short *args)

{
  ostringstream oss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  format<short>((ostream *)aoStack_198,fmt,args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}